

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_set_rounding_mode_riscv64(CPURISCVState_conflict2 *env,uint32_t rm)

{
  uintptr_t unaff_retaddr;
  int local_18;
  uint32_t local_14;
  int softrm;
  uint32_t rm_local;
  CPURISCVState_conflict2 *env_local;
  
  local_14 = rm;
  if (rm == 7) {
    local_14 = (uint32_t)env->frm;
  }
  switch(local_14) {
  case 0:
    local_18 = 0;
    break;
  case 1:
    local_18 = 3;
    break;
  case 2:
    local_18 = 1;
    break;
  case 3:
    local_18 = 2;
    break;
  case 4:
    local_18 = 4;
    break;
  default:
    riscv_raise_exception_riscv64(env,2,unaff_retaddr);
  }
  set_float_rounding_mode(local_18,&env->fp_status);
  return;
}

Assistant:

void helper_set_rounding_mode(CPURISCVState *env, uint32_t rm)
{
    int softrm;

    if (rm == 7) {
        rm = env->frm;
    }
    switch (rm) {
    case 0:
        softrm = float_round_nearest_even;
        break;
    case 1:
        softrm = float_round_to_zero;
        break;
    case 2:
        softrm = float_round_down;
        break;
    case 3:
        softrm = float_round_up;
        break;
    case 4:
        softrm = float_round_ties_away;
        break;
    default:
        riscv_raise_exception(env, RISCV_EXCP_ILLEGAL_INST, GETPC());
    }

    set_float_rounding_mode(softrm, &env->fp_status);
}